

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZParFrontStructMatrix.cpp
# Opt level: O0

TPZMatrix<std::complex<double>_> * __thiscall
TPZParFrontStructMatrix<TPZFrontNonSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>
::CreateAssemble(TPZParFrontStructMatrix<TPZFrontNonSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>
                 *this,TPZFMatrix<std::complex<double>_> *rhs,
                TPZAutoPointer<TPZGuiInterface> *guiInterface)

{
  int iVar1;
  int64_t iVar2;
  TPZMatrix<std::complex<double>_> *this_00;
  undefined4 extraout_var;
  long *in_RSI;
  long *in_RDI;
  TPZParFrontMatrix<std::complex<double>,_TPZFileEqnStorage<std::complex<double>_>,_TPZFrontNonSym<std::complex<double>_>_>
  *mat;
  int64_t neq;
  TPZEquationFilter *in_stack_ffffffffffffff88;
  TPZMatrix<std::complex<double>_> *this_01;
  TPZParFrontMatrix<std::complex<double>,_TPZFileEqnStorage<std::complex<double>_>,_TPZFrontNonSym<std::complex<double>_>_>
  *in_stack_ffffffffffffffc0;
  
  TPZStructMatrixOT<std::complex<double>_>::InitCreateAssemble
            ((TPZStructMatrixOT<std::complex<double>_> *)mat);
  iVar2 = TPZEquationFilter::NActiveEquations(in_stack_ffffffffffffff88);
  this_00 = (TPZMatrix<std::complex<double>_> *)operator_new(800);
  TPZParFrontMatrix<std::complex<double>,_TPZFileEqnStorage<std::complex<double>_>,_TPZFrontNonSym<std::complex<double>_>_>
  ::TPZParFrontMatrix(in_stack_ffffffffffffffc0,(int64_t)this_00);
  if (*(int *)((long)in_RDI + 0x144) != 0) {
    iVar1 = (*(this_00->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x4f])();
    (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x50))
              ((long *)CONCAT44(extraout_var,iVar1),*(undefined4 *)((long)in_RDI + 0x144));
  }
  (**(code **)(*in_RSI + 0x70))(in_RSI,iVar2,1);
  this_01 = this_00;
  TPZAutoPointer<TPZGuiInterface>::TPZAutoPointer
            ((TPZAutoPointer<TPZGuiInterface> *)this_00,
             (TPZAutoPointer<TPZGuiInterface> *)in_stack_ffffffffffffff88);
  (**(code **)(*in_RDI + 0x78))(in_RDI,this_01,in_RSI,&stack0xffffffffffffffc0);
  TPZAutoPointer<TPZGuiInterface>::~TPZAutoPointer((TPZAutoPointer<TPZGuiInterface> *)this_01);
  return this_00;
}

Assistant:

TPZMatrix<TVar> * TPZParFrontStructMatrix<TFront,TVar,TPar>::CreateAssemble(TPZFMatrix<TVar> &rhs,TPZAutoPointer<TPZGuiInterface> guiInterface)
{
    TPar::InitCreateAssemble();
	
	//TPZFrontMatrix<TPZStackEqnStorage, TFront> *mat = new TPZFrontMatrix<TPZStackEqnStorage, TFront>(fMesh->NEquations());
	
	//TPZFrontMatrix<TPZFileEqnStorage, TFront> *mat = new TPZFrontMatrix<TPZFileEqnStorage, TFront>(fMesh->NEquations());
	int64_t neq = this->fEquationFilter.NActiveEquations();
	
	//
#ifdef STACKSTORAGE
	TPZParFrontMatrix<TVar, TPZStackEqnStorage<TVar>, TFront> *mat = new TPZParFrontMatrix<TVar, TPZStackEqnStorage<TVar>, TFront>(neq);
#else
    TPZParFrontMatrix<TVar, TPZFileEqnStorage<TVar>, TFront> *mat = new TPZParFrontMatrix<TVar, TPZFileEqnStorage<TVar>, TFront>(neq);
#endif
    if (this->fDecomposeType != ENoDecompose)
    {
        mat->GetFront().SetDecomposeType(this->fDecomposeType);
    }
	rhs.Redim(neq,1);
	
	Assemble(*mat,rhs,guiInterface);
	return mat;
	
}